

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

QWidget * QApplication::widgetAt(QPoint *p)

{
  int x;
  int y;
  long lVar1;
  bool bVar2;
  char cVar3;
  QWidget *this;
  QPoint QVar4;
  QWidget *pQVar5;
  QWidget *pQVar6;
  long in_FS_OFFSET;
  QRegion local_68;
  QRect local_60;
  QRegion local_50;
  QRegion newmask;
  QRegion oldmask;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = topLevelAt(p);
  if (this == (QWidget *)0x0) {
    pQVar5 = (QWidget *)0x0;
  }
  else {
    bVar2 = QWidget::testAttribute_helper(this,WA_TransparentForMouseEvents);
    if (!bVar2) {
      QVar4 = QWidget::mapFromGlobal(this,p);
      local_60.x1.m_i = QVar4.xp.m_i;
      local_60.y1.m_i = QVar4.yp.m_i;
      pQVar5 = QWidget::childAt(this,(QPoint *)&local_60);
      if (pQVar5 != (QWidget *)0x0) goto LAB_002bb9ca;
    }
    bVar2 = QWidget::testAttribute_helper(this,WA_TransparentForMouseEvents);
    pQVar5 = this;
    if (bVar2) {
      x = (p->xp).m_i;
      y = (p->yp).m_i;
      oldmask.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QWidget::mask((QWidget *)&oldmask);
      local_60.x1.m_i = (p->xp).m_i;
      local_60.y1.m_i = (p->yp).m_i;
      QVar4 = QWidget::mapFromGlobal(this,(QPoint *)&local_60);
      newmask.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      cVar3 = QRegion::isEmpty();
      if (cVar3 == '\0') {
        QRegion::QRegion(&local_50,&oldmask);
      }
      else {
        local_60 = QWidget::rect(this);
        QRegion::QRegion(&local_50,&local_60,Rectangle);
      }
      pQVar5 = (QWidget *)0x0;
      QRegion::QRegion(&local_68,QVar4.xp.m_i.m_i,QVar4.yp.m_i.m_i,1,1,Rectangle);
      QRegion::operator-(&newmask,&local_50);
      QRegion::~QRegion(&local_68);
      QRegion::~QRegion(&local_50);
      QWidget::setMask(this,&newmask);
      pQVar6 = topLevelAt(p);
      if (pQVar6 != this) {
        pQVar5 = widgetAt(x,y);
      }
      cVar3 = QRegion::isEmpty();
      if (cVar3 == '\0') {
        QWidget::setMask(this,&oldmask);
      }
      else {
        QWidget::clearMask(this);
      }
      QRegion::~QRegion(&newmask);
      QRegion::~QRegion(&oldmask);
    }
  }
LAB_002bb9ca:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pQVar5;
}

Assistant:

QWidget *QApplication::widgetAt(const QPoint &p)
{
    QWidget *window = QApplication::topLevelAt(p);
    if (!window)
        return nullptr;

    QWidget *child = nullptr;

    if (!window->testAttribute(Qt::WA_TransparentForMouseEvents))
        child = window->childAt(window->mapFromGlobal(p));

    if (child)
        return child;

    if (window->testAttribute(Qt::WA_TransparentForMouseEvents)) {
        //shoot a hole in the widget and try once again,
        //suboptimal on Qt for Embedded Linux where we do
        //know the stacking order of the toplevels.
        int x = p.x();
        int y = p.y();
        QRegion oldmask = window->mask();
        QPoint wpoint = window->mapFromGlobal(QPoint(x, y));
        QRegion newmask = (oldmask.isEmpty() ? QRegion(window->rect()) : oldmask)
                          - QRegion(wpoint.x(), wpoint.y(), 1, 1);
        window->setMask(newmask);
        QWidget *recurse = nullptr;
        if (QApplication::topLevelAt(p) != window) // verify recursion will terminate
            recurse = widgetAt(x, y);
        if (oldmask.isEmpty())
            window->clearMask();
        else
            window->setMask(oldmask);
        return recurse;
    }
    return window;
}